

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack3_8(uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 7;
  out[1] = *in >> 3 & 7;
  out[2] = *in >> 6 & 7;
  out[3] = *in >> 9 & 7;
  out[4] = *in >> 0xc & 7;
  out[5] = *in >> 0xf & 7;
  out[6] = *in >> 0x12 & 7;
  out[7] = *in >> 0x15 & 7;
  return in + 1;
}

Assistant:

const uint32_t *__fastunpack3_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 3);
  out++;
  *out = ((*in) >> 3) % (1U << 3);
  out++;
  *out = ((*in) >> 6) % (1U << 3);
  out++;
  *out = ((*in) >> 9) % (1U << 3);
  out++;
  *out = ((*in) >> 12) % (1U << 3);
  out++;
  *out = ((*in) >> 15) % (1U << 3);
  out++;
  *out = ((*in) >> 18) % (1U << 3);
  out++;
  *out = ((*in) >> 21) % (1U << 3);
  out++;

  return in + 1;
}